

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O2

void slang::ast::ClockVarSymbol::fromSyntax
               (Scope *scope,ClockingItemSyntax *syntax,
               SmallVectorBase<const_slang::ast::ClockVarSymbol_*> *results)

{
  Scope *pSVar1;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  int iVar2;
  ClockingDirectionSyntax *pCVar3;
  AttributeSpecSyntax *pAVar4;
  ClockVarSymbol *this;
  undefined4 extraout_var;
  SourceLocation SVar5;
  ValueSymbol *symbol;
  DeclaredType *target;
  Expression *pEVar6;
  Diagnostic *this_00;
  LookupLocation LVar7;
  ClockingSkew CVar8;
  string_view sVar9;
  SourceRange SVar10;
  LookupLocation location;
  undefined1 isDottedAccess;
  ArgumentDirection dir;
  ClockVarSymbol *arg;
  char *local_128;
  SymbolIndex local_11c;
  Compilation *local_118;
  ClockingSkew local_110;
  ClockingSkew local_100;
  Scope *local_f0;
  ulong local_e8;
  Scope *local_e0;
  SmallVectorBase<const_slang::ast::ClockVarSymbol_*> *local_d8;
  SourceLocation local_d0;
  ASTContext context;
  Token name;
  const_iterator __begin2;
  bitmask<slang::ast::ASTFlags> local_58;
  Symbol *pSStack_50;
  TempVarSymbol *local_48;
  RandomizeDetails *pRStack_40;
  AssertionInstanceDetails *local_38;
  
  local_118 = scope->compilation;
  pSVar1 = scope->thisSym->parentScope;
  local_e0 = pSVar1;
  local_d8 = results;
  LVar7 = LookupLocation::before(scope->thisSym);
  local_f0 = LVar7.scope;
  dir = In;
  local_11c = LVar7.index;
  context.lookupIndex = local_11c;
  local_100.edge = None;
  context.flags.m_bits = 0x20;
  local_100.delay = (TimingControl *)0x0;
  local_110.edge = None;
  context.instanceOrProc = (Symbol *)0x0;
  context.firstTempVar = (TempVarSymbol *)0x0;
  local_110.delay = (TimingControl *)0x0;
  context.randomizeDetails = (RandomizeDetails *)0x0;
  context.assertionInstance = (AssertionInstanceDetails *)0x0;
  pCVar3 = (syntax->direction).ptr;
  context.scope.ptr = pSVar1;
  if ((pCVar3->input).kind == InOutKeyword) {
    dir = InOut;
  }
  else {
    if (((pCVar3->input).info != (Info *)0x0) && (pCVar3->inputSkew != (ClockingSkewSyntax *)0x0)) {
      CVar8 = ClockingSkew::fromSyntax
                        ((ClockingSkew *)pCVar3->inputSkew,(ClockingSkewSyntax *)&context,
                         LVar7._8_8_);
      local_100.delay = CVar8.delay;
      LVar7._8_8_ = local_100.delay;
      LVar7.scope = local_f0;
      local_100.edge = CVar8.edge;
      pCVar3 = (syntax->direction).ptr;
    }
    local_f0 = LVar7.scope;
    if ((pCVar3->output).info == (Info *)0x0) goto LAB_003b951f;
    dir = InOut - ((pCVar3->input).info == (Info *)0x0);
    if (pCVar3->outputSkew != (ClockingSkewSyntax *)0x0) {
      CVar8 = ClockingSkew::fromSyntax
                        ((ClockingSkew *)pCVar3->outputSkew,(ClockingSkewSyntax *)&context,
                         LVar7._8_8_);
      local_110.delay = CVar8.delay;
      local_110.edge = CVar8.edge;
    }
  }
  ASTContext::resetFlags((ASTContext *)&__begin2,&context,(bitmask<slang::ast::ASTFlags>)0x100000);
  context.assertionInstance = local_38;
  context.firstTempVar = local_48;
  context.randomizeDetails = pRStack_40;
  context.flags.m_bits = local_58.m_bits;
  context.instanceOrProc = pSStack_50;
  context.scope.ptr = (Scope *)__begin2.list;
  context._8_8_ = __begin2.index;
LAB_003b951f:
  pSVar1 = local_e0;
  __begin2.index = 0;
  local_e8 = (syntax->decls).elements._M_extent._M_extent_value + 1 >> 1;
  __begin2.list = &syntax->decls;
  do {
    if ((__begin2.list == &syntax->decls) && (__begin2.index == local_e8)) {
      return;
    }
    pAVar4 = slang::syntax::SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>::
             iterator_base<const_slang::syntax::AttributeSpecSyntax_*>::dereference(&__begin2);
    name.kind = (pAVar4->name).kind;
    name._2_1_ = (pAVar4->name).field_0x2;
    name.numFlags.raw = (pAVar4->name).numFlags.raw;
    name.rawLen = (pAVar4->name).rawLen;
    name.info = (pAVar4->name).info;
    _arg = parsing::Token::valueText(&name);
    local_d0 = parsing::Token::location(&name);
    this = BumpAllocator::
           emplace<slang::ast::ClockVarSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::ArgumentDirection&,slang::ast::ClockingSkew&,slang::ast::ClockingSkew&>
                     (&local_118->super_BumpAllocator,
                      (basic_string_view<char,_std::char_traits<char>_> *)&arg,&local_d0,&dir,
                      &local_100,&local_110);
    arg = this;
    (this->super_VariableSymbol).super_ValueSymbol.super_Symbol.originatingSyntax =
         &pAVar4->super_SyntaxNode;
    syntax_00._M_ptr =
         (syntax->super_MemberSyntax).attributes.
         super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    syntax_00._M_extent._M_extent_value =
         (syntax->super_MemberSyntax).attributes.
         super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
         _M_extent_value;
    Symbol::setAttributes((Symbol *)this,pSVar1,syntax_00);
    SmallVectorBase<slang::ast::ClockVarSymbol_const*>::
    emplace_back<slang::ast::ClockVarSymbol_const*const&>
              ((SmallVectorBase<slang::ast::ClockVarSymbol_const*> *)local_d8,&arg);
    if (pAVar4->value == (EqualsValueClauseSyntax *)0x0) {
      sVar9 = parsing::Token::valueText(&name);
      SVar10 = parsing::Token::range(&name);
      isDottedAccess = SVar10.endLoc._0_1_;
      location.index = local_11c;
      location.scope = local_f0;
      location._12_4_ = 0;
      symbol = (ValueSymbol *)
               Lookup::unqualifiedAt
                         (pSVar1,sVar9,location,SVar10,(bitmask<slang::ast::LookupFlags>)0x0);
      if (symbol != (ValueSymbol *)0x0) {
        if ((symbol->super_Symbol).kind - Net < 2) {
          target = Symbol::getDeclaredType((Symbol *)symbol);
          DeclaredType::setLink(&(arg->super_VariableSymbol).super_ValueSymbol.declaredType,target);
          SVar5 = (arg->super_VariableSymbol).super_ValueSymbol.super_Symbol.location;
          SVar10.startLoc =
               (arg->super_VariableSymbol).super_ValueSymbol.super_Symbol.name._M_len * 0x10000000 +
               (long)SVar5;
          SVar10.endLoc = (SourceLocation)0x0;
          pEVar6 = ValueExpressionBase::fromSymbol
                             ((ValueExpressionBase *)&context,(ASTContext *)symbol,(Symbol *)0x0,
                              (HierarchicalReference *)SVar5,SVar10,false,(bool)isDottedAccess);
          if (dir != In) {
            ASTContext::addDriver(&context,symbol,pEVar6,(bitmask<slang::ast::AssignFlags>)0x20);
          }
          goto LAB_003b977b;
        }
        SVar10 = parsing::Token::range(&name);
        this_00 = ASTContext::addDiag(&context,(DiagCode)0x550006,SVar10);
        sVar9 = parsing::Token::valueText(&name);
        Diagnostic::operator<<(this_00,sVar9);
        Diagnostic::addNote(this_00,(DiagCode)0x50001,(symbol->super_Symbol).location);
      }
      (arg->super_VariableSymbol).super_ValueSymbol.declaredType.type = local_118->errorType;
    }
    else {
      iVar2 = Expression::bind((int)(pAVar4->value->expr).ptr,(sockaddr *)&context,0);
      pEVar6 = (Expression *)CONCAT44(extraout_var,iVar2);
      (arg->super_VariableSymbol).super_ValueSymbol.declaredType.type = (pEVar6->type).ptr;
      (arg->super_VariableSymbol).super_ValueSymbol.declaredType.initializer = pEVar6;
      if (dir != In) {
        SVar5 = parsing::Token::location(&pAVar4->value->equals);
        Expression::requireLValue
                  (pEVar6,&context,SVar5,(bitmask<slang::ast::AssignFlags>)0x20,(Expression *)0x0);
      }
    }
LAB_003b977b:
    __begin2.index = __begin2.index + 1;
  } while( true );
}

Assistant:

void ClockVarSymbol::fromSyntax(const Scope& scope, const ClockingItemSyntax& syntax,
                                SmallVectorBase<const ClockVarSymbol*>& results) {
    // Lookups should happen in the parent of the clocking block, since other
    // clocking block members cannot reference each other.
    auto& comp = scope.getCompilation();
    auto parent = scope.asSymbol().getParentScope();
    SLANG_ASSERT(parent);

    LookupLocation ll = LookupLocation::before(scope.asSymbol());
    ASTContext context(*parent, ll, ASTFlags::NonProcedural);

    ArgumentDirection dir = ArgumentDirection::In;
    ClockingSkew inputSkew, outputSkew;
    if (syntax.direction->input.kind == TokenKind::InOutKeyword) {
        dir = ArgumentDirection::InOut;
    }
    else {
        if (syntax.direction->input) {
            if (syntax.direction->inputSkew)
                inputSkew = ClockingSkew::fromSyntax(*syntax.direction->inputSkew, context);
        }

        if (syntax.direction->output) {
            dir = syntax.direction->input ? ArgumentDirection::InOut : ArgumentDirection::Out;
            if (syntax.direction->outputSkew)
                outputSkew = ClockingSkew::fromSyntax(*syntax.direction->outputSkew, context);
        }
    }

    if (dir == ArgumentDirection::Out || dir == ArgumentDirection::InOut)
        context = context.resetFlags(ASTFlags::LValue);

    for (auto decl : syntax.decls) {
        auto name = decl->name;
        auto arg = comp.emplace<ClockVarSymbol>(name.valueText(), name.location(), dir, inputSkew,
                                                outputSkew);
        arg->setSyntax(*decl);
        arg->setAttributes(*parent, syntax.attributes);
        results.push_back(arg);

        // If there is an initializer expression we take our type from that.
        // Otherwise we need to lookup the signal in our parent scope and
        // take the type from that.
        if (decl->value) {
            auto& expr = Expression::bind(*decl->value->expr, context);
            arg->setType(*expr.type);
            arg->setInitializer(expr);

            if (dir != ArgumentDirection::In)
                expr.requireLValue(context, decl->value->equals.location(), AssignFlags::ClockVar);
        }
        else {
            auto sym = Lookup::unqualifiedAt(*parent, name.valueText(), ll, name.range());
            if (sym && sym->kind != SymbolKind::Net && sym->kind != SymbolKind::Variable) {
                auto& diag = context.addDiag(diag::InvalidClockingSignal, name.range());
                diag << name.valueText();
                diag.addNote(diag::NoteDeclarationHere, sym->location);
                sym = nullptr;
            }

            if (sym) {
                auto sourceType = sym->getDeclaredType();
                SLANG_ASSERT(sourceType);
                arg->getDeclaredType()->setLink(*sourceType);

                auto& valExpr = ValueExpressionBase::fromSymbol(
                    context, *sym, nullptr, {arg->location, arg->location + arg->name.length()});

                if (dir != ArgumentDirection::In)
                    context.addDriver(sym->as<ValueSymbol>(), valExpr, AssignFlags::ClockVar);
            }
            else {
                arg->getDeclaredType()->setType(comp.getErrorType());
            }
        }
    }
}